

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O3

openssh_new_key * load_openssh_new_key(BinarySource *filesrc,char **errmsg_p)

{
  byte bVar1;
  size_t sVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  uint uVar6;
  openssh_new_key *b;
  strbuf *psVar7;
  byte *__s1;
  size_t sVar8;
  unsigned_long uVar9;
  char *pcVar10;
  openssh_new_cipher oVar11;
  long lVar12;
  openssh_new_kdf oVar13;
  char *pcVar14;
  byte *pbVar15;
  bool bVar16;
  ptrlen pVar17;
  char base64_bit [4];
  BinarySource src [1];
  BinarySource opts [1];
  byte local_8c [4];
  BinarySource local_88;
  BinarySource local_58;
  
  b = (openssh_new_key *)safemalloc(1,0x40,0);
  psVar7 = strbuf_new_nm();
  b->keyblob = psVar7;
  pVar17 = BinarySource_get_chomped_line(filesrc->binarysource_);
  pcVar14 = "unexpected end of file";
  if ((filesrc->binarysource_->err == BSE_NO_ERROR) &&
     (__s1 = (byte *)mkstr(pVar17), __s1 != (byte *)0x0)) {
    iVar4 = strcmp((char *)__s1,"-----BEGIN OPENSSH PRIVATE KEY-----");
    if (iVar4 != 0) {
      pcVar14 = "file does not begin with OpenSSH new-style key header";
LAB_00115b5c:
      sVar8 = strlen((char *)__s1);
      smemclr(__s1,sVar8);
      safefree(__s1);
      goto LAB_00115b77;
    }
    sVar8 = strlen((char *)__s1);
    smemclr(__s1,sVar8);
    safefree(__s1);
    pVar17 = BinarySource_get_chomped_line(filesrc->binarysource_);
    if (filesrc->binarysource_->err == BSE_NO_ERROR) {
      iVar4 = 0;
LAB_00115bd5:
      __s1 = (byte *)mkstr(pVar17);
      if (__s1 != (byte *)0x0) {
        iVar5 = strcmp((char *)__s1,"-----END OPENSSH PRIVATE KEY-----");
        pbVar15 = __s1;
        if (iVar5 != 0) goto LAB_00115c02;
        safefree(__s1);
        sVar2 = b->keyblob->len;
        if (sVar2 == 0) {
          pcVar14 = "key body not present";
          goto LAB_00115ae5;
        }
        local_88.data = b->keyblob->u;
        local_88.pos = 0;
        local_88.err = BSE_NO_ERROR;
        local_88.len = sVar2;
        local_88.binarysource_ = &local_88;
        pcVar14 = BinarySource_get_asciz(&local_88);
        iVar4 = strcmp(pcVar14,"openssh-key-v1");
        if (iVar4 != 0) {
          pcVar14 = "new-style OpenSSH magic number missing\n";
          goto LAB_00115ae5;
        }
        pVar17 = BinarySource_get_string(local_88.binarysource_);
        _Var3 = ptrlen_eq_string(pVar17,"none");
        oVar13 = ON_K_NONE;
        oVar11 = ON_E_NONE;
        if (_Var3) {
LAB_00115da6:
          b->cipher = oVar11;
          pVar17 = BinarySource_get_string(local_88.binarysource_);
          _Var3 = ptrlen_eq_string(pVar17,"none");
          if (!_Var3) {
            _Var3 = ptrlen_eq_string(pVar17,"bcrypt");
            oVar13 = ON_K_BCRYPT;
            if (!_Var3) {
              bVar16 = (local_88.binarysource_)->err == BSE_NO_ERROR;
              pcVar10 = "unrecognised kdf name\n";
              pcVar14 = "no kdf name found";
              goto LAB_00115f0b;
            }
          }
          b->kdf = oVar13;
          pVar17 = BinarySource_get_string(local_88.binarysource_);
          if (b->kdf == ON_K_BCRYPT) {
            local_58.binarysource_ = &local_58;
            local_58.pos = 0;
            local_58.err = BSE_NO_ERROR;
            local_58.data = pVar17.ptr;
            local_58.len = pVar17.len;
            pVar17 = BinarySource_get_string(local_58.binarysource_);
            (b->kdfopts).bcrypt.salt = pVar17;
            uVar9 = BinarySource_get_uint32(local_58.binarysource_);
            (b->kdfopts).bcrypt.rounds = (int)uVar9;
            if ((local_58.binarysource_)->err != BSE_NO_ERROR) {
              pcVar14 = "failed to parse bcrypt options string";
              goto LAB_00115ae5;
            }
          }
          else if ((b->kdf == ON_K_NONE) && (pVar17.len != 0)) {
            pcVar14 = "expected empty options string for \'none\' kdf";
            goto LAB_00115ae5;
          }
          uVar9 = BinarySource_get_uint32(local_88.binarysource_);
          b->nkeys = (int)uVar9;
          if ((int)uVar9 != 1) {
            bVar16 = (local_88.binarysource_)->err == BSE_NO_ERROR;
            pcVar10 = "multiple keys in new-style OpenSSH key file not supported\n";
            pcVar14 = "no key count found";
            goto LAB_00115f0b;
          }
          b->key_wanted = 0;
          uVar6 = 0;
          do {
            BinarySource_get_string(local_88.binarysource_);
            uVar6 = uVar6 + 1;
          } while (uVar6 < (uint)b->nkeys);
          pVar17 = BinarySource_get_string(local_88.binarysource_);
          b->private = pVar17;
          if ((local_88.binarysource_)->err != BSE_NO_ERROR) {
            pcVar14 = "no private key container string found\n";
            goto LAB_00115ae5;
          }
          smemclr(local_8c,4);
          if (errmsg_p == (char **)0x0) {
            return b;
          }
          pcVar14 = (char *)0x0;
          goto LAB_00115b1a;
        }
        _Var3 = ptrlen_eq_string(pVar17,"aes256-cbc");
        oVar11 = ON_E_AES256CBC;
        if (_Var3) goto LAB_00115da6;
        _Var3 = ptrlen_eq_string(pVar17,"aes256-ctr");
        oVar11 = ON_E_AES256CTR;
        if (_Var3) goto LAB_00115da6;
        bVar16 = (local_88.binarysource_)->err == BSE_NO_ERROR;
        pcVar10 = "unrecognised cipher name\n";
        pcVar14 = "no cipher name found";
LAB_00115f0b:
        if (bVar16) {
          pcVar14 = pcVar10;
        }
        goto LAB_00115ae5;
      }
      goto LAB_00115cb3;
    }
  }
LAB_00115ae5:
  smemclr(local_8c,4);
LAB_00115af4:
  strbuf_free(b->keyblob);
  smemclr(b,0x40);
  safefree(b);
LAB_00115b12:
  b = (openssh_new_key *)0x0;
  if (errmsg_p != (char **)0x0) {
LAB_00115b1a:
    *errmsg_p = pcVar14;
  }
  return b;
LAB_00115c02:
  while (((bVar1 = *pbVar15, (byte)(bVar1 - 0x30) < 10 || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) ||
         ((bVar1 < 0x3e && ((0x2000880000000000U >> ((ulong)(uint)bVar1 & 0x3f) & 1) != 0))))) {
    lVar12 = (long)iVar4;
    iVar4 = iVar4 + 1;
    local_8c[lVar12] = bVar1;
    if (iVar4 == 4) {
      uVar6 = base64_decode_atom((char *)local_8c,(uchar *)&local_88);
      if ((int)uVar6 < 1) {
        pcVar14 = "invalid base64 encoding";
        goto LAB_00115b5c;
      }
      BinarySink_put_data(b->keyblob->binarysink_,&local_88,(ulong)uVar6);
      smemclr(&local_88,3);
      iVar4 = 0;
    }
    pbVar15 = pbVar15 + 1;
  }
  sVar8 = strlen((char *)__s1);
  smemclr(__s1,sVar8);
  safefree(__s1);
  pVar17 = BinarySource_get_chomped_line(filesrc->binarysource_);
  if (filesrc->binarysource_->err != BSE_NO_ERROR) goto LAB_00115cb3;
  goto LAB_00115bd5;
LAB_00115cb3:
  pcVar14 = "unexpected end of file";
LAB_00115b77:
  smemclr(local_8c,4);
  if (b == (openssh_new_key *)0x0) goto LAB_00115b12;
  goto LAB_00115af4;
}

Assistant:

static struct openssh_new_key *load_openssh_new_key(BinarySource *filesrc,
                                                    const char **errmsg_p)
{
    struct openssh_new_key *ret;
    char *line = NULL;
    const char *errmsg;
    char *p;
    char base64_bit[4];
    int base64_chars = 0;
    BinarySource src[1];
    ptrlen str;
    unsigned key_index;

    ret = snew(struct openssh_new_key);
    ret->keyblob = strbuf_new_nm();

    if (!(line = bsgetline(filesrc))) {
        errmsg = "unexpected end of file";
        goto error;
    }
    if (0 != strcmp(line, "-----BEGIN OPENSSH PRIVATE KEY-----")) {
        errmsg = "file does not begin with OpenSSH new-style key header";
        goto error;
    }
    smemclr(line, strlen(line));
    sfree(line);
    line = NULL;

    while (1) {
        if (!(line = bsgetline(filesrc))) {
            errmsg = "unexpected end of file";
            goto error;
        }
        if (0 == strcmp(line, "-----END OPENSSH PRIVATE KEY-----")) {
            sfree(line);
            line = NULL;
            break;                     /* done */
        }

        p = line;
        while (isbase64(*p)) {
            base64_bit[base64_chars++] = *p;
            if (base64_chars == 4) {
                unsigned char out[3];
                int len;

                base64_chars = 0;

                len = base64_decode_atom(base64_bit, out);

                if (len <= 0) {
                    errmsg = "invalid base64 encoding";
                    goto error;
                }

                put_data(ret->keyblob, out, len);

                smemclr(out, sizeof(out));
            }

            p++;
        }
        smemclr(line, strlen(line));
        sfree(line);
        line = NULL;
    }

    if (ret->keyblob->len == 0) {
        errmsg = "key body not present";
        goto error;
    }

    BinarySource_BARE_INIT_PL(src, ptrlen_from_strbuf(ret->keyblob));

    if (strcmp(get_asciz(src), "openssh-key-v1") != 0) {
        errmsg = "new-style OpenSSH magic number missing\n";
        goto error;
    }

    /* Cipher name */
    str = get_string(src);
    if (ptrlen_eq_string(str, "none")) {
        ret->cipher = ON_E_NONE;
    } else if (ptrlen_eq_string(str, "aes256-cbc")) {
        ret->cipher = ON_E_AES256CBC;
    } else if (ptrlen_eq_string(str, "aes256-ctr")) {
        ret->cipher = ON_E_AES256CTR;
    } else {
        errmsg = get_err(src) ? "no cipher name found" :
            "unrecognised cipher name\n";
        goto error;
    }

    /* Key derivation function name */
    str = get_string(src);
    if (ptrlen_eq_string(str, "none")) {
        ret->kdf = ON_K_NONE;
    } else if (ptrlen_eq_string(str, "bcrypt")) {
        ret->kdf = ON_K_BCRYPT;
    } else {
        errmsg = get_err(src) ? "no kdf name found" :
            "unrecognised kdf name\n";
        goto error;
    }

    /* KDF extra options */
    str = get_string(src);
    switch (ret->kdf) {
      case ON_K_NONE:
        if (str.len != 0) {
            errmsg = "expected empty options string for 'none' kdf";
            goto error;
        }
        break;
      case ON_K_BCRYPT: {
        BinarySource opts[1];

        BinarySource_BARE_INIT_PL(opts, str);
        ret->kdfopts.bcrypt.salt = get_string(opts);
        ret->kdfopts.bcrypt.rounds = get_uint32(opts);

        if (get_err(opts)) {
          errmsg = "failed to parse bcrypt options string";
          goto error;
        }
        break;
      }
    }

    /*
     * At this point we expect a uint32 saying how many keys are
     * stored in this file. OpenSSH new-style key files can
     * contain more than one. Currently we don't have any user
     * interface to specify which one we're trying to extract, so
     * we just bomb out with an error if more than one is found in
     * the file. However, I've put in all the mechanism here to
     * extract the nth one for a given n, in case we later connect
     * up some UI to that mechanism. Just arrange that the
     * 'key_wanted' field is set to a value in the range [0,
     * nkeys) by some mechanism.
     */
    ret->nkeys = toint(get_uint32(src));
    if (ret->nkeys != 1) {
        errmsg = get_err(src) ? "no key count found" :
            "multiple keys in new-style OpenSSH key file not supported\n";
        goto error;
    }
    ret->key_wanted = 0;

    /* Read and ignore a string per public key. */
    for (key_index = 0; key_index < ret->nkeys; key_index++)
        str = get_string(src);

    /*
     * Now we expect a string containing the encrypted part of the
     * key file.
     */
    ret->private = get_string(src);
    if (get_err(src)) {
        errmsg = "no private key container string found\n";
        goto error;
    }

    /*
     * And now we're done, until asked to actually decrypt.
     */

    smemclr(base64_bit, sizeof(base64_bit));
    if (errmsg_p) *errmsg_p = NULL;
    return ret;

    error:
    if (line) {
        smemclr(line, strlen(line));
        sfree(line);
        line = NULL;
    }
    smemclr(base64_bit, sizeof(base64_bit));
    if (ret) {
        strbuf_free(ret->keyblob);
        smemclr(ret, sizeof(*ret));
        sfree(ret);
    }
    if (errmsg_p) *errmsg_p = errmsg;
    return NULL;
}